

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawTriangle(Vector2 v1,Vector2 v2,Vector2 v3,Color color)

{
  undefined1 local_24;
  undefined1 uStack_23;
  undefined1 uStack_22;
  undefined1 uStack_21;
  undefined4 uStack_20;
  Color color_local;
  Vector2 v3_local;
  Vector2 v2_local;
  Vector2 v1_local;
  
  rlCheckRenderBatchLimit(4);
  rlSetTexture(texShapes.id);
  rlBegin(7);
  local_24 = color.r;
  uStack_23 = color.g;
  uStack_22 = color.b;
  uStack_21 = color.a;
  rlColor4ub(local_24,uStack_23,uStack_22,uStack_21);
  rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height);
  v2_local.x = v1.x;
  v2_local.y = v1.y;
  rlVertex2f(v2_local.x,v2_local.y);
  rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
               (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
  v3_local.x = v2.x;
  v3_local.y = v2.y;
  rlVertex2f(v3_local.x,v3_local.y);
  rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
               (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
  rlVertex2f(v3_local.x,v3_local.y);
  rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
               texShapesRec.y / (float)texShapes.height);
  uStack_20 = v3.x;
  color_local = (Color)v3.y;
  rlVertex2f(uStack_20,(float)color_local);
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawTriangle(Vector2 v1, Vector2 v2, Vector2 v3, Color color)
{
    rlCheckRenderBatchLimit(4);

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlSetTexture(texShapes.id);

    rlBegin(RL_QUADS);
        rlColor4ub(color.r, color.g, color.b, color.a);

        rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(v1.x, v1.y);

        rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(v2.x, v2.y);

        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(v2.x, v2.y);

        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(v3.x, v3.y);
    rlEnd();

    rlSetTexture(0);
#else
    rlBegin(RL_TRIANGLES);
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f(v1.x, v1.y);
        rlVertex2f(v2.x, v2.y);
        rlVertex2f(v3.x, v3.y);
    rlEnd();
#endif
}